

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetWindowPos(ImGuiWindow *window,ImVec2 *pos,ImGuiCond cond)

{
  bool local_41;
  ImVec2 local_40;
  ImVec2 offset;
  ImVec2 local_30;
  ImVec2 old_pos;
  ImGuiCond cond_local;
  ImVec2 *pos_local;
  ImGuiWindow *window_local;
  
  if ((cond == 0) || (((char)*(undefined4 *)&window->field_0xb4 & cond) != 0)) {
    local_41 = true;
    if (cond != 0) {
      local_41 = ImIsPowerOfTwo(cond);
    }
    if (local_41 == false) {
      __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/gulrak[P]relive-client/thirdparty/imgui/imgui.cpp"
                    ,0x1a46,"void ImGui::SetWindowPos(ImGuiWindow *, const ImVec2 &, ImGuiCond)");
    }
    *(uint *)&window->field_0xb4 = *(uint *)&window->field_0xb4 & 0xfffffff1;
    ImVec2::ImVec2((ImVec2 *)&old_pos.y,3.4028235e+38,3.4028235e+38);
    window->SetWindowPosVal = stack0xffffffffffffffdc;
    local_30 = window->Pos;
    offset = ImFloor(pos);
    window->Pos = offset;
    local_40 = ::operator-(&window->Pos,&local_30);
    ::operator+=(&(window->DC).CursorPos,&local_40);
    ::operator+=(&(window->DC).CursorMaxPos,&local_40);
    ::operator+=(&(window->DC).IdealMaxPos,&local_40);
    ::operator+=(&(window->DC).CursorStartPos,&local_40);
  }
  return;
}

Assistant:

void ImGui::SetWindowPos(ImGuiWindow* window, const ImVec2& pos, ImGuiCond cond)
{
    // Test condition (NB: bit 0 is always true) and clear flags for next time
    if (cond && (window->SetWindowPosAllowFlags & cond) == 0)
        return;

    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    window->SetWindowPosAllowFlags &= ~(ImGuiCond_Once | ImGuiCond_FirstUseEver | ImGuiCond_Appearing);
    window->SetWindowPosVal = ImVec2(FLT_MAX, FLT_MAX);

    // Set
    const ImVec2 old_pos = window->Pos;
    window->Pos = ImFloor(pos);
    ImVec2 offset = window->Pos - old_pos;
    window->DC.CursorPos += offset;         // As we happen to move the window while it is being appended to (which is a bad idea - will smear) let's at least offset the cursor
    window->DC.CursorMaxPos += offset;      // And more importantly we need to offset CursorMaxPos/CursorStartPos this so ContentSize calculation doesn't get affected.
    window->DC.IdealMaxPos += offset;
    window->DC.CursorStartPos += offset;
}